

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

void ImStb::stb_textedit_delete(ImGuiInputTextState *str,STB_TexteditState *state,int where,int len)

{
  ImWchar *pIVar1;
  ulong uVar2;
  
  pIVar1 = stb_text_createundo(&state->undostate,where,len,0);
  if (0 < len && pIVar1 != (ImWchar *)0x0) {
    if (where < 0) {
LAB_00167ff5:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                    ,0x659,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    uVar2 = 0;
    do {
      if ((str->TextW).Size <= where + (int)uVar2) goto LAB_00167ff5;
      pIVar1[uVar2] = (str->TextW).Data[(uint)where + uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  STB_TEXTEDIT_DELETECHARS(str,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}